

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_set_tstamp_precision(pcap_t *p,int tstamp_precision)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (p->activated == 0) {
    iVar2 = -0xc;
    if (-1 < tstamp_precision) {
      uVar1 = p->tstamp_precision_count;
      if ((ulong)uVar1 == 0) {
        if (tstamp_precision == 0) {
          (p->opt).tstamp_precision = 0;
          return 0;
        }
      }
      else if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (p->tstamp_precision_list[uVar3] == tstamp_precision) {
            (p->opt).tstamp_precision = tstamp_precision;
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
    }
  }
  else {
    builtin_strncpy(p->errbuf,"can\'t perform  operation on activated capture",0x2e);
    iVar2 = -4;
  }
  return iVar2;
}

Assistant:

int
pcap_set_tstamp_precision(pcap_t *p, int tstamp_precision)
{
	int i;

	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);

	/*
	 * The argument should have been u_int, but that's too late
	 * to change now - it's an API.
	 */
	if (tstamp_precision < 0)
		return (PCAP_ERROR_TSTAMP_PRECISION_NOTSUP);

	/*
	 * If p->tstamp_precision_count is 0, we only support setting
	 * the time stamp precision to microsecond precision; every
	 * pcap module *MUST* support microsecond precision, even if
	 * it does so by converting the native precision to
	 * microseconds.
	 */
	if (p->tstamp_precision_count == 0) {
		if (tstamp_precision == PCAP_TSTAMP_PRECISION_MICRO) {
			p->opt.tstamp_precision = tstamp_precision;
			return (0);
		}
	} else {
		/*
		 * Check whether we claim to support this precision of
		 * time stamp.
		 */
		for (i = 0; i < p->tstamp_precision_count; i++) {
			if (p->tstamp_precision_list[i] == (u_int)tstamp_precision) {
				/*
				 * Yes.
				 */
				p->opt.tstamp_precision = tstamp_precision;
				return (0);
			}
		}
	}

	/*
	 * We don't support this time stamp precision.
	 */
	return (PCAP_ERROR_TSTAMP_PRECISION_NOTSUP);
}